

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rbuVfsClose(sqlite3_file *pFile)

{
  _func_int_sqlite3_file_ptr_sqlite3_int64 **pp_Var1;
  sqlite3_file *psVar2;
  _func_int_sqlite3_file_ptr_sqlite3_int64_ptr **pp_Var3;
  _func_int_sqlite3_file_ptr_int **pp_Var4;
  int iVar5;
  sqlite3rbu *pRbu;
  sqlite3_io_methods *psVar6;
  _func_int_sqlite3_file_ptr_int **pp_Var7;
  _func_int_sqlite3_file_ptr_sqlite3_int64_ptr **pp_Var8;
  long lVar9;
  
  if (0 < *(int *)((long)&pFile[6].pMethods + 4)) {
    lVar9 = 0;
    do {
      sqlite3_free(*(void **)(&(pFile[7].pMethods)->iVersion + lVar9 * 2));
      lVar9 = lVar9 + 1;
    } while (lVar9 < *(int *)((long)&pFile[6].pMethods + 4));
  }
  sqlite3_free(pFile[7].pMethods);
  pFile[7].pMethods = (sqlite3_io_methods *)0x0;
  sqlite3_free(pFile[8].pMethods);
  if ((*(uint *)&pFile[5].pMethods >> 8 & 1) == 0) {
    if (((*(uint *)&pFile[5].pMethods & 8) != 0) && (pFile[3].pMethods != (sqlite3_io_methods *)0x0)
       ) {
      pp_Var1 = &pFile[3].pMethods[2].xTruncate;
      *pp_Var1 = *pp_Var1 + -(long)pFile[4].pMethods;
      pFile[4].pMethods = (sqlite3_io_methods *)0x0;
    }
  }
  else {
    psVar6 = pFile[2].pMethods;
    if ((sqlite3_mutex *)psVar6[1].xWrite != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)((sqlite3_mutex *)psVar6[1].xWrite);
      psVar6 = pFile[2].pMethods;
    }
    pp_Var4 = &psVar6[1].xSync;
    do {
      pp_Var7 = pp_Var4;
      psVar2 = (sqlite3_file *)*pp_Var7;
      if (psVar2 == (sqlite3_file *)0x0) break;
      pp_Var4 = (_func_int_sqlite3_file_ptr_int **)(psVar2 + 0xb);
    } while (psVar2 != pFile);
    if (psVar2 != (sqlite3_file *)0x0) {
      *pp_Var7 = (_func_int_sqlite3_file_ptr_int *)pFile[0xb].pMethods;
      psVar6 = pFile[2].pMethods;
    }
    pFile[0xb].pMethods = (sqlite3_io_methods *)0x0;
    pp_Var3 = &psVar6[1].xFileSize;
    do {
      pp_Var8 = pp_Var3;
      psVar2 = (sqlite3_file *)*pp_Var8;
      if (psVar2 == (sqlite3_file *)0x0) break;
      pp_Var3 = (_func_int_sqlite3_file_ptr_sqlite3_int64_ptr **)(psVar2 + 0xc);
    } while (psVar2 != pFile);
    if (psVar2 != (sqlite3_file *)0x0) {
      *pp_Var8 = (_func_int_sqlite3_file_ptr_sqlite3_int64_ptr *)pFile[0xc].pMethods;
      psVar6 = pFile[2].pMethods;
    }
    pFile[0xc].pMethods = (sqlite3_io_methods *)0x0;
    if ((sqlite3_mutex *)psVar6[1].xWrite != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)((sqlite3_mutex *)psVar6[1].xWrite);
    }
    rbuUnlockShm((rbu_file *)pFile);
    (**(code **)(*(long *)pFile[1].pMethods + 0x80))(pFile[1].pMethods,0);
  }
  iVar5 = (**(code **)(*(long *)pFile[1].pMethods + 8))();
  return iVar5;
}

Assistant:

static int rbuVfsClose(sqlite3_file *pFile){
  rbu_file *p = (rbu_file*)pFile;
  int rc;
  int i;

  /* Free the contents of the apShm[] array. And the array itself. */
  for(i=0; i<p->nShm; i++){
    sqlite3_free(p->apShm[i]);
  }
  sqlite3_free(p->apShm);
  p->apShm = 0;
  sqlite3_free(p->zDel);

  if( p->openFlags & SQLITE_OPEN_MAIN_DB ){
    rbuMainlistRemove(p);
    rbuUnlockShm(p);
    p->pReal->pMethods->xShmUnmap(p->pReal, 0);
  }
  else if( (p->openFlags & SQLITE_OPEN_DELETEONCLOSE) && p->pRbu ){
    rbuUpdateTempSize(p, 0);
  }
  assert( p->pMainNext==0 && p->pRbuVfs->pMain!=p );

  /* Close the underlying file handle */
  rc = p->pReal->pMethods->xClose(p->pReal);
  return rc;
}